

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateDotLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  int iVar1;
  bool bVar2;
  Type *pTVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  _Rb_tree_header *p_Var6;
  string err;
  Result r;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,2,2);
  Result::operator=(&r,(Result *)&err);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  bVar2 = Result::good(&r);
  if (bVar2) {
    validateOutputCount((Result *)&err,layer,1,1);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
  }
  bVar2 = Result::good(&r);
  if ((bVar2) && (this->ndArrayInterpretation == true)) {
    std::__cxx11::string::string((string *)&local_50,"DotProduct",(allocator *)&local_b0);
    this_00 = &this->blobNameToRank;
    validateInputOutputRankEquality((Result *)&err,layer,&local_50,this_00);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
    std::__cxx11::string::~string((string *)&local_50);
    bVar2 = Result::good(&r);
    if (bVar2) {
      std::__cxx11::string::string((string *)&local_b0,"DotProduct",(allocator *)&local_90);
      validateRankCount((Result *)&err,layer,&local_b0,3,-1,this_00);
      Result::operator=(&r,(Result *)&err);
      std::__cxx11::string::~string((string *)&err._M_string_length);
      std::__cxx11::string::~string((string *)&local_b0);
      bVar2 = Result::good(&r);
      if (bVar2) {
        this_01 = &layer->input_;
        pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_01->super_RepeatedPtrFieldBase,0);
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&this_00->_M_t,pTVar3);
        p_Var6 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)iVar4._M_node != p_Var6) {
          pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this_01->super_RepeatedPtrFieldBase,1);
          iVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::find(&this_00->_M_t,pTVar3);
          if ((_Rb_tree_header *)iVar4._M_node != p_Var6) {
            pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                               (&this_01->super_RepeatedPtrFieldBase,0);
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::at(this_00,pTVar3);
            iVar1 = *pmVar5;
            pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                               (&this_01->super_RepeatedPtrFieldBase,1);
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::at(this_00,pTVar3);
            if (iVar1 != *pmVar5) {
              err._M_dataplus._M_p = (pointer)&err.field_2;
              err._M_string_length = 0;
              err.field_2._M_local_buf[0] = '\0';
              std::__cxx11::string::string((string *)&local_70,(string *)(layer->name_).ptr_);
              std::operator+(&local_90,"Layer \'",&local_70);
              std::operator+(&local_b0,&local_90,
                             "\' of type \'DotProduct\' expects equal ranks for its inputs, but they are not equal."
                            );
              std::__cxx11::string::operator=((string *)&err,(string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_90);
              std::__cxx11::string::~string((string *)&local_70);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
              std::__cxx11::string::~string((string *)&err);
              goto LAB_0024eaf6;
            }
          }
        }
      }
    }
  }
  Result::Result(__return_storage_ptr__,&r);
LAB_0024eaf6:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateDotLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    // 2 inputs, 1 output
    r = validateInputCount(layer, 2, 2);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "DotProduct", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "DotProduct", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}

        if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end() &&
            blobNameToRank.find(layer.input(1)) != blobNameToRank.end()) {
            if (blobNameToRank.at(layer.input(0)) != blobNameToRank.at(layer.input(1))) {
                std::string err;
                err = "Layer '" + std::string(layer.name()) + "' of type 'DotProduct' expects equal ranks for its inputs, but they are not equal.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
    }

    return r;
}